

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::FullyConnectedLayer::calcSensitivityFactors(FullyConnectedLayer *this)

{
  element_type *peVar1;
  size_t sVar2;
  element_type *peVar3;
  size_t sVar4;
  element_type *peVar5;
  size_t sVar6;
  float *pfVar7;
  float *pfVar8;
  float *m_begin;
  float *pfVar9;
  float *pfVar10;
  float *m_end;
  
  peVar1 = (this->weightSensitivity).
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = peVar1->_M_size;
  if (sVar2 != ((this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_size) {
    __assert_fail("weightSensitivity->size() == weights->size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5df,"void notch::FullyConnectedLayer::calcSensitivityFactors()");
  }
  peVar3 = (this->biasSensitivity).
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->_M_size !=
      ((this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_size) {
    __assert_fail("biasSensitivity->size() == bias->size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5e0,"void notch::FullyConnectedLayer::calcSensitivityFactors()");
  }
  sVar4 = (this->localGrad)._M_size;
  if (sVar4 != this->nOutputs) {
    __assert_fail("localGrad.size() == nOutputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5e1,"void notch::FullyConnectedLayer::calcSensitivityFactors()");
  }
  peVar5 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar6 = peVar5->_M_size;
  if (sVar6 != this->nInputs) {
    __assert_fail("input.size() == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5e3,"void notch::FullyConnectedLayer::calcSensitivityFactors()");
  }
  pfVar7 = (this->localGrad)._M_data;
  pfVar10 = pfVar7 + sVar4;
  if (sVar4 == 0) {
    pfVar10 = (float *)0x0;
    pfVar7 = (float *)0x0;
  }
  pfVar8 = peVar5->_M_data;
  pfVar9 = pfVar8 + sVar6;
  if (sVar6 == 0) {
    pfVar9 = (float *)0x0;
    pfVar8 = (float *)0x0;
  }
  m_begin = peVar1->_M_data;
  m_end = m_begin + sVar2;
  if (sVar2 == 0) {
    m_end = (float *)0x0;
    m_begin = (float *)0x0;
  }
  internal::outer<float*,float*,float*>(-1.0,pfVar7,pfVar10,pfVar8,pfVar9,m_begin,m_end);
  sVar2 = (this->localGrad)._M_size;
  pfVar7 = (this->localGrad)._M_data;
  pfVar10 = pfVar7 + sVar2;
  if (sVar2 == 0) {
    pfVar10 = (float *)0x0;
    pfVar7 = (float *)0x0;
  }
  pfVar8 = peVar3->_M_data;
  pfVar9 = pfVar8 + peVar3->_M_size;
  if (peVar3->_M_size == 0) {
    pfVar9 = (float *)0x0;
    pfVar8 = (float *)0x0;
  }
  internal::scale<float*>(-1.0,pfVar7,pfVar10,pfVar8,pfVar9);
  return;
}

Assistant:

virtual std::shared_ptr<const Array> getWeightSensitivity() const { return nullptr; }